

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  float *pfVar1;
  RTCRayQueryContext *pRVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  size_t k;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  bool bVar40;
  int iVar41;
  float *vertices;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [32];
  ulong uVar47;
  uint uVar48;
  undefined4 uVar49;
  ulong unaff_R12;
  NodeRef root;
  long lVar50;
  long lVar51;
  ulong *puVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [36];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar90 [36];
  undefined1 auVar86 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  uint uVar104;
  uint uVar107;
  uint uVar108;
  uint uVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar112 [32];
  float fVar113;
  undefined1 auVar114 [32];
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5fc1;
  undefined1 local_5fc0 [32];
  RTCFilterFunctionNArguments local_5f90;
  undefined1 local_5f60 [8];
  float fStack_5f58;
  float fStack_5f54;
  float fStack_5f50;
  float fStack_5f4c;
  float fStack_5f48;
  float fStack_5f44;
  Geometry *local_5f30;
  RayK<8> *local_5f28;
  undefined1 local_5f20 [32];
  undefined1 local_5f00 [48];
  ulong local_5ed0;
  undefined1 (*local_5ec8) [32];
  undefined1 local_5ec0 [8];
  undefined1 auStack_5eb8 [8];
  float fStack_5eb0;
  float fStack_5eac;
  float fStack_5ea8;
  float fStack_5ea4;
  undefined1 local_5ea0 [32];
  Intersectors *local_5e78;
  long local_5e70;
  Scene *local_5e68;
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [8];
  float fStack_5e38;
  float fStack_5e34;
  float fStack_5e30;
  float fStack_5e2c;
  float fStack_5e28;
  float fStack_5e24;
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  float local_5dc0;
  float fStack_5dbc;
  float fStack_5db8;
  float fStack_5db4;
  float fStack_5db0;
  float fStack_5dac;
  float fStack_5da8;
  float fStack_5da4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5da0;
  RTCRayQueryContext local_5d80 [4];
  RTCRayN local_5d60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5d40;
  undefined1 local_5ce0 [8];
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  undefined4 uStack_5cc4;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [8];
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined1 local_5c80 [32];
  uint local_5c60;
  uint uStack_5c5c;
  uint uStack_5c58;
  uint uStack_5c54;
  uint uStack_5c50;
  uint uStack_5c4c;
  uint uStack_5c48;
  uint uStack_5c44;
  uint local_5c40;
  uint uStack_5c3c;
  uint uStack_5c38;
  uint uStack_5c34;
  uint uStack_5c30;
  uint uStack_5c2c;
  uint uStack_5c28;
  uint uStack_5c24;
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  int local_5ba0 [8];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5b80;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined1 local_5b00 [32];
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  float fStack_5ac4;
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  undefined1 local_5aa0 [32];
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar71 [36];
  undefined1 auVar72 [36];
  
  bvh = (BVH *)This->ptr;
  local_5808 = (bvh->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar68 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar56 = ZEXT816(0) << 0x40;
      auVar75 = vpcmpeqd_avx2(auVar68,(undefined1  [32])valid_i->field_0);
      auVar68 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar56),5);
      auVar57 = auVar75 & auVar68;
      if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar57 >> 0x7f,0) != '\0') ||
            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar57 >> 0xbf,0) != '\0') ||
          (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar57[0x1f] < '\0') {
        auVar68 = vandps_avx(auVar68,auVar75);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5bc0._8_4_ = 0x7fffffff;
        local_5bc0._0_8_ = 0x7fffffff7fffffff;
        local_5bc0._12_4_ = 0x7fffffff;
        local_5bc0._16_4_ = 0x7fffffff;
        local_5bc0._20_4_ = 0x7fffffff;
        local_5bc0._24_4_ = 0x7fffffff;
        local_5bc0._28_4_ = 0x7fffffff;
        auVar65._8_4_ = 0x219392ef;
        auVar65._0_8_ = 0x219392ef219392ef;
        auVar65._12_4_ = 0x219392ef;
        auVar65._16_4_ = 0x219392ef;
        auVar65._20_4_ = 0x219392ef;
        auVar65._24_4_ = 0x219392ef;
        auVar65._28_4_ = 0x219392ef;
        auVar57 = vandps_avx(local_5bc0,local_59e0);
        auVar57 = vcmpps_avx(auVar57,auVar65,1);
        auVar75 = vblendvps_avx(local_59e0,auVar65,auVar57);
        auVar57 = vandps_avx(local_5bc0,local_59c0);
        auVar57 = vcmpps_avx(auVar57,auVar65,1);
        auVar76 = vblendvps_avx(local_59c0,auVar65,auVar57);
        auVar57 = vandps_avx(local_59a0,local_5bc0);
        auVar57 = vcmpps_avx(auVar57,auVar65,1);
        auVar57 = vblendvps_avx(local_59a0,auVar65,auVar57);
        auVar4 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
        auVar69 = ZEXT1664(auVar4);
        auVar68 = vrcpps_avx(auVar75);
        auVar105._8_4_ = 0x3f800000;
        auVar105._0_8_ = 0x3f8000003f800000;
        auVar105._12_4_ = 0x3f800000;
        auVar105._16_4_ = 0x3f800000;
        auVar105._20_4_ = 0x3f800000;
        auVar105._24_4_ = 0x3f800000;
        auVar105._28_4_ = 0x3f800000;
        auVar12 = vfnmadd213ps_fma(auVar75,auVar68,auVar105);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar68,auVar68);
        auVar68 = vrcpps_avx(auVar76);
        auVar13 = vfnmadd213ps_fma(auVar76,auVar68,auVar105);
        auVar75 = vrcpps_avx(auVar57);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar68,auVar68);
        auVar14 = vfnmadd213ps_fma(auVar57,auVar75,auVar105);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar75,auVar75);
        local_5980 = ZEXT1632(auVar12);
        local_5960 = ZEXT1632(auVar13);
        local_5940 = ZEXT1632(auVar14);
        local_5920 = auVar12._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar12._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar12._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar12._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar13._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar13._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar13._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar13._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar14._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar14._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar14._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar14._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar68 = vcmpps_avx(local_5980,ZEXT1632(auVar56),1);
        auVar75._8_4_ = 0x20;
        auVar75._0_8_ = 0x2000000020;
        auVar75._12_4_ = 0x20;
        auVar75._16_4_ = 0x20;
        auVar75._20_4_ = 0x20;
        auVar75._24_4_ = 0x20;
        auVar75._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar68,auVar75);
        auVar57 = ZEXT1632(auVar56);
        auVar68 = vcmpps_avx(ZEXT1632(auVar13),auVar57,5);
        auVar76._8_4_ = 0x40;
        auVar76._0_8_ = 0x4000000040;
        auVar76._12_4_ = 0x40;
        auVar76._16_4_ = 0x40;
        auVar76._20_4_ = 0x40;
        auVar76._24_4_ = 0x40;
        auVar76._28_4_ = 0x40;
        auVar83._8_4_ = 0x60;
        auVar83._0_8_ = 0x6000000060;
        auVar83._12_4_ = 0x60;
        auVar83._16_4_ = 0x60;
        auVar83._20_4_ = 0x60;
        auVar83._24_4_ = 0x60;
        auVar83._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar83,auVar76,auVar68);
        auVar68 = vcmpps_avx(ZEXT1632(auVar14),auVar57,5);
        auVar77._8_4_ = 0x80;
        auVar77._0_8_ = 0x8000000080;
        auVar77._12_4_ = 0x80;
        auVar77._16_4_ = 0x80;
        auVar77._20_4_ = 0x80;
        auVar77._24_4_ = 0x80;
        auVar77._28_4_ = 0x80;
        auVar84._8_4_ = 0xa0;
        auVar84._0_8_ = 0xa0000000a0;
        auVar84._12_4_ = 0xa0;
        auVar84._16_4_ = 0xa0;
        auVar84._20_4_ = 0xa0;
        auVar84._24_4_ = 0xa0;
        auVar84._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar84,auVar77,auVar68);
        auVar68 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar57);
        local_5b00 = vpmovsxwd_avx2(auVar4);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar103 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar68,local_5b00);
        auVar68 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar57);
        auVar57._8_4_ = 0xff800000;
        auVar57._0_8_ = 0xff800000ff800000;
        auVar57._12_4_ = 0xff800000;
        auVar57._16_4_ = 0xff800000;
        auVar57._20_4_ = 0xff800000;
        auVar57._24_4_ = 0xff800000;
        auVar57._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar57,auVar68,local_5b00);
        auVar56 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5e20 = vpmovsxwd_avx2(auVar4 ^ auVar56);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar48 = 7;
        }
        else {
          uVar48 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f28 = ray + 0x100;
        puVar52 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar46 = (undefined1 (*) [32])local_4640;
        local_5b20 = mm_lookupmask_ps._16_8_;
        uStack_5b18 = mm_lookupmask_ps._24_8_;
        uStack_5b10 = mm_lookupmask_ps._16_8_;
        uStack_5b08 = mm_lookupmask_ps._24_8_;
        local_4660 = local_5860;
        local_5b40 = mm_lookupmask_pd._0_8_;
        uStack_5b38 = mm_lookupmask_pd._8_8_;
        uStack_5b30 = mm_lookupmask_pd._0_8_;
        uStack_5b28 = mm_lookupmask_pd._8_8_;
        local_5ec8 = (undefined1 (*) [32])&local_5c60;
        local_5e78 = This;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_016a466b:
        do {
          do {
            root.ptr = puVar52[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_016a57b7;
            puVar52 = puVar52 + -1;
            pauVar46 = pauVar46 + -1;
            _local_5f60 = *pauVar46;
            auVar68 = vcmpps_avx(_local_5f60,local_5840,1);
          } while ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar68 >> 0x7f,0) == '\0') &&
                     (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar68 >> 0xbf,0) == '\0') &&
                   (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar68[0x1f]);
          uVar49 = vmovmskps_avx(auVar68);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar49);
          if (uVar48 < (uint)POPCOUNT(uVar49)) {
LAB_016a46a8:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_016a57b7;
                auVar68 = vcmpps_avx(local_5840,_local_5f60,6);
                if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar68 >> 0x7f,0) == '\0') &&
                      (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0xbf,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar68[0x1f]) goto LAB_016a466b;
                lVar43 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar68 = vpcmpeqd_avx2(auVar68,auVar68);
                lVar50 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                lVar42 = 0;
                local_5de0 = auVar68 ^ local_5e20;
                goto LAB_016a4885;
              }
              uVar44 = 8;
              _local_5f60 = auVar103._0_32_;
              for (lVar43 = 0;
                  (lVar43 != 8 &&
                  (uVar45 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar43 * 8), uVar45 != 8));
                  lVar43 = lVar43 + 1) {
                uVar49 = *(undefined4 *)(root.ptr + 0x40 + lVar43 * 4);
                auVar58._4_4_ = uVar49;
                auVar58._0_4_ = uVar49;
                auVar58._8_4_ = uVar49;
                auVar58._12_4_ = uVar49;
                auVar58._16_4_ = uVar49;
                auVar58._20_4_ = uVar49;
                auVar58._24_4_ = uVar49;
                auVar58._28_4_ = uVar49;
                auVar37._4_4_ = fStack_591c;
                auVar37._0_4_ = local_5920;
                auVar37._8_4_ = fStack_5918;
                auVar37._12_4_ = fStack_5914;
                auVar37._16_4_ = fStack_5910;
                auVar37._20_4_ = fStack_590c;
                auVar37._24_4_ = fStack_5908;
                auVar37._28_4_ = uStack_5904;
                uVar49 = *(undefined4 *)(root.ptr + 0x80 + lVar43 * 4);
                auVar85._4_4_ = uVar49;
                auVar85._0_4_ = uVar49;
                auVar85._8_4_ = uVar49;
                auVar85._12_4_ = uVar49;
                auVar85._16_4_ = uVar49;
                auVar85._20_4_ = uVar49;
                auVar85._24_4_ = uVar49;
                auVar85._28_4_ = uVar49;
                auVar56 = vfmsub213ps_fma(auVar58,local_5980,auVar37);
                auVar38._4_4_ = fStack_58fc;
                auVar38._0_4_ = local_5900;
                auVar38._8_4_ = fStack_58f8;
                auVar38._12_4_ = fStack_58f4;
                auVar38._16_4_ = fStack_58f0;
                auVar38._20_4_ = fStack_58ec;
                auVar38._24_4_ = fStack_58e8;
                auVar38._28_4_ = uStack_58e4;
                uVar49 = *(undefined4 *)(root.ptr + 0xc0 + lVar43 * 4);
                auVar95._4_4_ = uVar49;
                auVar95._0_4_ = uVar49;
                auVar95._8_4_ = uVar49;
                auVar95._12_4_ = uVar49;
                auVar95._16_4_ = uVar49;
                auVar95._20_4_ = uVar49;
                auVar95._24_4_ = uVar49;
                auVar95._28_4_ = uVar49;
                auVar4 = vfmsub213ps_fma(auVar85,local_5960,auVar38);
                auVar39._4_4_ = fStack_58dc;
                auVar39._0_4_ = local_58e0;
                auVar39._8_4_ = fStack_58d8;
                auVar39._12_4_ = fStack_58d4;
                auVar39._16_4_ = fStack_58d0;
                auVar39._20_4_ = fStack_58cc;
                auVar39._24_4_ = fStack_58c8;
                auVar39._28_4_ = uStack_58c4;
                uVar49 = *(undefined4 *)(root.ptr + 0x60 + lVar43 * 4);
                auVar101._4_4_ = uVar49;
                auVar101._0_4_ = uVar49;
                auVar101._8_4_ = uVar49;
                auVar101._12_4_ = uVar49;
                auVar101._16_4_ = uVar49;
                auVar101._20_4_ = uVar49;
                auVar101._24_4_ = uVar49;
                auVar101._28_4_ = uVar49;
                auVar12 = vfmsub213ps_fma(auVar95,local_5940,auVar39);
                auVar13 = vfmsub213ps_fma(auVar101,local_5980,auVar37);
                uVar49 = *(undefined4 *)(root.ptr + 0xa0 + lVar43 * 4);
                auVar78._4_4_ = uVar49;
                auVar78._0_4_ = uVar49;
                auVar78._8_4_ = uVar49;
                auVar78._12_4_ = uVar49;
                auVar78._16_4_ = uVar49;
                auVar78._20_4_ = uVar49;
                auVar78._24_4_ = uVar49;
                auVar78._28_4_ = uVar49;
                auVar14 = vfmsub213ps_fma(auVar78,local_5960,auVar38);
                uVar49 = *(undefined4 *)(root.ptr + 0xe0 + lVar43 * 4);
                auVar63._4_4_ = uVar49;
                auVar63._0_4_ = uVar49;
                auVar63._8_4_ = uVar49;
                auVar63._12_4_ = uVar49;
                auVar63._16_4_ = uVar49;
                auVar63._20_4_ = uVar49;
                auVar63._24_4_ = uVar49;
                auVar63._28_4_ = uVar49;
                auVar9 = vfmsub213ps_fma(auVar63,local_5940,auVar39);
                auVar68 = vpminsd_avx2(ZEXT1632(auVar56),ZEXT1632(auVar13));
                auVar57 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar14));
                auVar68 = vpmaxsd_avx2(auVar68,auVar57);
                auVar57 = vpminsd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar9));
                auVar75 = vpmaxsd_avx2(auVar68,auVar57);
                auVar68 = vpmaxsd_avx2(ZEXT1632(auVar56),ZEXT1632(auVar13));
                auVar57 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar14));
                auVar57 = vpminsd_avx2(auVar68,auVar57);
                auVar68 = vpmaxsd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar9));
                auVar57 = vpminsd_avx2(auVar57,auVar68);
                auVar68 = vpmaxsd_avx2(auVar75,local_5860);
                auVar69 = ZEXT3264(auVar68);
                auVar57 = vpminsd_avx2(auVar57,local_5840);
                auVar57 = vcmpps_avx(auVar68,auVar57,2);
                uVar47 = uVar44;
                auVar68 = _local_5f60;
                if (((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar57 >> 0x7f,0) != '\0') ||
                       (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar57 >> 0xbf,0) != '\0') ||
                     (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar57[0x1f] < '\0') &&
                   (auVar68 = vblendvps_avx(auVar103._0_32_,auVar75,auVar57), uVar47 = uVar45,
                   uVar44 != 8)) {
                  *puVar52 = uVar44;
                  puVar52 = puVar52 + 1;
                  *pauVar46 = _local_5f60;
                  pauVar46 = pauVar46 + 1;
                }
                _local_5f60 = auVar68;
                uVar44 = uVar47;
              }
              if (uVar44 == 8) goto LAB_016a4826;
              auVar68 = vcmpps_avx(local_5840,_local_5f60,6);
              uVar49 = vmovmskps_avx(auVar68);
              root.ptr = uVar44;
            } while ((byte)uVar48 < (byte)POPCOUNT(uVar49));
            *puVar52 = uVar44;
            puVar52 = puVar52 + 1;
            *pauVar46 = _local_5f60;
            pauVar46 = pauVar46 + 1;
LAB_016a4826:
            iVar41 = 4;
          }
          else {
            while (unaff_R12 != 0) {
              k = 0;
              for (uVar44 = unaff_R12; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              unaff_R12 = unaff_R12 - 1 & unaff_R12;
              local_5fc0._0_8_ = k;
              auVar69 = ZEXT1664(auVar69._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              bVar40 = occluded1(local_5e78,bvh,root,k,&local_5fc1,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar40) {
                *(undefined4 *)(local_5e20 + local_5fc0._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar68 = _DAT_01f7b020 & ~local_5e20;
            iVar41 = 3;
            auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0x7f,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0xbf,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar68[0x1f] < '\0') {
              auVar68._8_4_ = 0xff800000;
              auVar68._0_8_ = 0xff800000ff800000;
              auVar68._12_4_ = 0xff800000;
              auVar68._16_4_ = 0xff800000;
              auVar68._20_4_ = 0xff800000;
              auVar68._24_4_ = 0xff800000;
              auVar68._28_4_ = 0xff800000;
              auVar69 = ZEXT3264(auVar68);
              local_5840 = vblendvps_avx(local_5840,auVar68,local_5e20);
              iVar41 = 2;
            }
            unaff_R12 = 0;
            if (uVar48 < (uint)POPCOUNT(uVar49)) goto LAB_016a46a8;
          }
        } while (iVar41 != 3);
LAB_016a57b7:
        auVar68 = vandps_avx(local_5b00,local_5e20);
        auVar62._8_4_ = 0xff800000;
        auVar62._0_8_ = 0xff800000ff800000;
        auVar62._12_4_ = 0xff800000;
        auVar62._16_4_ = 0xff800000;
        auVar62._20_4_ = 0xff800000;
        auVar62._24_4_ = 0xff800000;
        auVar62._28_4_ = 0xff800000;
        auVar68 = vmaskmovps_avx(auVar68,auVar62);
        *(undefined1 (*) [32])local_5f28 = auVar68;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_016a4885:
  do {
    auVar68 = auVar69._0_32_;
    if (lVar42 == lVar43) break;
    local_5e68 = context->scene;
    local_5e70 = lVar42;
    auVar57 = local_5de0;
    for (lVar51 = -0x10; lVar51 != 0; lVar51 = lVar51 + 4) {
      iVar41 = *(int *)(lVar50 + 0x10 + lVar51);
      unaff_R12 = 0;
      if (iVar41 == -1) break;
      uVar47 = (ulong)*(uint *)(lVar50 + lVar51);
      pfVar1 = (local_5e68->vertices).items[uVar47];
      uVar44 = (ulong)*(uint *)(lVar50 + -0x40 + lVar51);
      uVar45 = (ulong)*(uint *)(lVar50 + -0x30 + lVar51);
      fVar82 = pfVar1[uVar44];
      auVar79._4_4_ = fVar82;
      auVar79._0_4_ = fVar82;
      auVar79._8_4_ = fVar82;
      auVar79._12_4_ = fVar82;
      auVar79._16_4_ = fVar82;
      auVar79._20_4_ = fVar82;
      auVar79._24_4_ = fVar82;
      auVar79._28_4_ = fVar82;
      fVar110 = pfVar1[uVar44 + 1];
      auVar96._4_4_ = fVar110;
      auVar96._0_4_ = fVar110;
      auVar96._8_4_ = fVar110;
      auVar96._12_4_ = fVar110;
      auVar96._16_4_ = fVar110;
      auVar96._20_4_ = fVar110;
      auVar96._24_4_ = fVar110;
      auVar96._28_4_ = fVar110;
      fVar111 = pfVar1[uVar44 + 2];
      auVar98._4_4_ = fVar111;
      auVar98._0_4_ = fVar111;
      auVar98._8_4_ = fVar111;
      auVar98._12_4_ = fVar111;
      auVar98._16_4_ = fVar111;
      auVar98._20_4_ = fVar111;
      auVar98._24_4_ = fVar111;
      auVar98._28_4_ = fVar111;
      local_5f60._4_4_ = pfVar1[uVar45];
      local_5ec0._4_4_ = pfVar1[uVar45 + 1];
      local_5e40._4_4_ = pfVar1[uVar45 + 2];
      uVar44 = (ulong)*(uint *)(lVar50 + -0x10 + lVar51);
      local_5dc0 = pfVar1[uVar44];
      local_5a60 = pfVar1[uVar44 + 1];
      local_5a80 = pfVar1[uVar44 + 2];
      local_5f60._0_4_ = local_5f60._4_4_;
      fStack_5f58 = (float)local_5f60._4_4_;
      fStack_5f54 = (float)local_5f60._4_4_;
      fStack_5f50 = (float)local_5f60._4_4_;
      fStack_5f4c = (float)local_5f60._4_4_;
      fStack_5f48 = (float)local_5f60._4_4_;
      fStack_5f44 = (float)local_5f60._4_4_;
      fVar113 = fVar82 - (float)local_5f60._4_4_;
      local_5f00._4_4_ = fVar113;
      local_5f00._0_4_ = fVar113;
      local_5f00._8_4_ = fVar113;
      local_5f00._12_4_ = fVar113;
      local_5f00._16_4_ = fVar113;
      local_5f00._20_4_ = fVar113;
      local_5f00._24_4_ = fVar113;
      local_5f00._28_4_ = fVar113;
      local_5ec0._0_4_ = local_5ec0._4_4_;
      auStack_5eb8._0_4_ = local_5ec0._4_4_;
      auStack_5eb8._4_4_ = local_5ec0._4_4_;
      fStack_5eb0 = (float)local_5ec0._4_4_;
      fStack_5eac = (float)local_5ec0._4_4_;
      fStack_5ea8 = (float)local_5ec0._4_4_;
      fStack_5ea4 = (float)local_5ec0._4_4_;
      fVar87 = fVar110 - (float)local_5ec0._4_4_;
      local_5e40._0_4_ = local_5e40._4_4_;
      fStack_5e38 = (float)local_5e40._4_4_;
      fStack_5e34 = (float)local_5e40._4_4_;
      fStack_5e30 = (float)local_5e40._4_4_;
      fStack_5e2c = (float)local_5e40._4_4_;
      fStack_5e28 = (float)local_5e40._4_4_;
      fStack_5e24 = (float)local_5e40._4_4_;
      fVar88 = fVar111 - (float)local_5e40._4_4_;
      local_5f20._4_4_ = fVar88;
      local_5f20._0_4_ = fVar88;
      local_5f20._8_4_ = fVar88;
      local_5f20._12_4_ = fVar88;
      local_5f20._16_4_ = fVar88;
      local_5f20._20_4_ = fVar88;
      local_5f20._24_4_ = fVar88;
      local_5f20._28_4_ = fVar88;
      fVar82 = local_5dc0 - fVar82;
      auVar106._4_4_ = fVar82;
      auVar106._0_4_ = fVar82;
      auVar106._8_4_ = fVar82;
      auVar106._12_4_ = fVar82;
      auVar106._16_4_ = fVar82;
      auVar106._20_4_ = fVar82;
      auVar106._24_4_ = fVar82;
      auVar106._28_4_ = fVar82;
      fVar82 = fVar88 * fVar82;
      fVar110 = local_5a60 - fVar110;
      fVar113 = fVar113 * fVar110;
      auVar112._4_4_ = fVar110;
      auVar112._0_4_ = fVar110;
      auVar112._8_4_ = fVar110;
      auVar112._12_4_ = fVar110;
      auVar112._16_4_ = fVar110;
      auVar112._20_4_ = fVar110;
      auVar112._24_4_ = fVar110;
      auVar112._28_4_ = fVar110;
      local_5e60._4_4_ = fVar87;
      local_5e60._0_4_ = fVar87;
      local_5e60._8_4_ = fVar87;
      local_5e60._12_4_ = fVar87;
      local_5e60._16_4_ = fVar87;
      local_5e60._20_4_ = fVar87;
      local_5e60._24_4_ = fVar87;
      local_5e60._28_4_ = fVar87;
      fVar110 = local_5a80 - fVar111;
      fVar87 = fVar87 * fVar110;
      auVar114._4_4_ = fVar110;
      auVar114._0_4_ = fVar110;
      auVar114._8_4_ = fVar110;
      auVar114._12_4_ = fVar110;
      auVar114._16_4_ = fVar110;
      auVar114._20_4_ = fVar110;
      auVar114._24_4_ = fVar110;
      auVar114._28_4_ = fVar110;
      auVar102._4_4_ = fVar87;
      auVar102._0_4_ = fVar87;
      auVar102._8_4_ = fVar87;
      auVar102._12_4_ = fVar87;
      auVar102._16_4_ = fVar87;
      auVar102._20_4_ = fVar87;
      auVar102._24_4_ = fVar87;
      auVar102._28_4_ = fVar87;
      auVar12 = vfmsub231ps_fma(auVar102,auVar112,local_5f20);
      auVar64._4_4_ = fVar82;
      auVar64._0_4_ = fVar82;
      auVar64._8_4_ = fVar82;
      auVar64._12_4_ = fVar82;
      auVar64._16_4_ = fVar82;
      auVar64._20_4_ = fVar82;
      auVar64._24_4_ = fVar82;
      auVar64._28_4_ = fVar82;
      auVar13 = vfmsub231ps_fma(auVar64,auVar114,local_5f00._0_32_);
      auVar72 = (undefined1  [36])0x0;
      auVar71 = (undefined1  [36])0x0;
      auVar70 = (undefined1  [36])0x0;
      auVar91._4_4_ = fVar113;
      auVar91._0_4_ = fVar113;
      auVar91._8_4_ = fVar113;
      auVar91._12_4_ = fVar113;
      auVar91._16_4_ = fVar113;
      auVar91._20_4_ = fVar113;
      auVar91._24_4_ = fVar113;
      auVar91._28_4_ = fVar113;
      auVar14 = vfmsub231ps_fma(auVar91,auVar106,local_5e60);
      auVar77 = vsubps_avx(auVar79,*(undefined1 (*) [32])ray);
      auVar83 = vsubps_avx(auVar96,*(undefined1 (*) [32])(ray + 0x20));
      auVar84 = vsubps_avx(auVar98,*(undefined1 (*) [32])(ray + 0x40));
      auVar68 = *(undefined1 (*) [32])(ray + 0x80);
      auVar75 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar5._4_4_ = auVar68._4_4_ * auVar83._4_4_;
      auVar5._0_4_ = auVar68._0_4_ * auVar83._0_4_;
      auVar5._8_4_ = auVar68._8_4_ * auVar83._8_4_;
      auVar5._12_4_ = auVar68._12_4_ * auVar83._12_4_;
      auVar5._16_4_ = auVar68._16_4_ * auVar83._16_4_;
      auVar5._20_4_ = auVar68._20_4_ * auVar83._20_4_;
      auVar5._24_4_ = auVar68._24_4_ * auVar83._24_4_;
      auVar5._28_4_ = fVar88;
      auVar9 = vfmsub231ps_fma(auVar5,auVar77,auVar75);
      auVar76 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar6._4_4_ = auVar14._4_4_ * auVar76._4_4_;
      auVar6._0_4_ = auVar14._0_4_ * auVar76._0_4_;
      auVar6._8_4_ = auVar14._8_4_ * auVar76._8_4_;
      auVar6._12_4_ = auVar14._12_4_ * auVar76._12_4_;
      auVar6._16_4_ = auVar76._16_4_ * 0.0;
      auVar6._20_4_ = auVar76._20_4_ * 0.0;
      auVar6._24_4_ = auVar76._24_4_ * 0.0;
      auVar6._28_4_ = fVar111;
      auVar65 = ZEXT1632(auVar13);
      auVar56 = vfmadd231ps_fma(auVar6,auVar65,auVar75);
      auVar69._0_4_ = auVar84._0_4_ * auVar75._0_4_;
      auVar69._4_4_ = auVar84._4_4_ * auVar75._4_4_;
      auVar69._8_4_ = auVar84._8_4_ * auVar75._8_4_;
      auVar69._12_4_ = auVar84._12_4_ * auVar75._12_4_;
      auVar69._16_4_ = auVar84._16_4_ * auVar75._16_4_;
      auVar69._20_4_ = auVar84._20_4_ * auVar75._20_4_;
      auVar69._28_36_ = in_ZMM15._28_36_;
      auVar69._24_4_ = auVar84._24_4_ * auVar75._24_4_;
      auVar10 = vfmsub231ps_fma(auVar69._0_32_,auVar83,auVar76);
      in_ZMM15 = ZEXT1664(auVar10);
      auVar7._4_4_ = auVar76._4_4_ * auVar77._4_4_;
      auVar7._0_4_ = auVar76._0_4_ * auVar77._0_4_;
      auVar7._8_4_ = auVar76._8_4_ * auVar77._8_4_;
      auVar7._12_4_ = auVar76._12_4_ * auVar77._12_4_;
      auVar7._16_4_ = auVar76._16_4_ * auVar77._16_4_;
      auVar7._20_4_ = auVar76._20_4_ * auVar77._20_4_;
      auVar7._24_4_ = auVar76._24_4_ * auVar77._24_4_;
      auVar7._28_4_ = auVar75._28_4_;
      auVar76 = ZEXT1632(auVar12);
      auVar90 = ZEXT436(0);
      auVar11 = vfmsub231ps_fma(auVar7,auVar84,auVar68);
      auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar76,auVar68);
      auVar8._4_4_ = fVar110 * auVar9._4_4_;
      auVar8._0_4_ = fVar110 * auVar9._0_4_;
      auVar8._8_4_ = fVar110 * auVar9._8_4_;
      auVar8._12_4_ = fVar110 * auVar9._12_4_;
      auVar8._16_4_ = fVar110 * 0.0;
      auVar8._20_4_ = fVar110 * 0.0;
      auVar8._24_4_ = fVar110 * 0.0;
      auVar8._28_4_ = auVar68._28_4_;
      auVar4 = vfmadd231ps_fma(auVar8,ZEXT1632(auVar11),auVar112);
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar10),auVar106);
      uVar44 = (ulong)*(uint *)(lVar50 + -0x20 + lVar51);
      local_5aa0._8_4_ = 0x80000000;
      local_5aa0._0_8_ = 0x8000000080000000;
      local_5aa0._12_4_ = 0x80000000;
      local_5aa0._16_4_ = 0x80000000;
      local_5aa0._20_4_ = 0x80000000;
      local_5aa0._24_4_ = 0x80000000;
      local_5aa0._28_4_ = 0x80000000;
      auVar68 = vandps_avx(ZEXT1632(auVar56),local_5aa0);
      uVar104 = auVar68._0_4_;
      auVar59._0_4_ = (float)(uVar104 ^ auVar4._0_4_);
      uVar107 = auVar68._4_4_;
      auVar59._4_4_ = (float)(uVar107 ^ auVar4._4_4_);
      uVar108 = auVar68._8_4_;
      auVar59._8_4_ = (float)(uVar108 ^ auVar4._8_4_);
      uVar109 = auVar68._12_4_;
      auVar59._12_4_ = (float)(uVar109 ^ auVar4._12_4_);
      fVar110 = auVar68._16_4_;
      auVar59._16_4_ = fVar110;
      fVar111 = auVar68._20_4_;
      auVar59._20_4_ = fVar111;
      fVar113 = auVar68._24_4_;
      auVar59._24_4_ = fVar113;
      uVar49 = auVar68._28_4_;
      auVar59._28_4_ = uVar49;
      auVar68 = vcmpps_avx(auVar59,_DAT_01f7b000,5);
      auVar75 = auVar57 & auVar68;
      local_5ac0 = pfVar1[uVar44];
      fVar82 = pfVar1[uVar44 + 1];
      auVar80._4_4_ = fVar82;
      auVar80._0_4_ = fVar82;
      auVar80._8_4_ = fVar82;
      auVar80._12_4_ = fVar82;
      auVar80._16_4_ = fVar82;
      auVar80._20_4_ = fVar82;
      auVar80._24_4_ = fVar82;
      auVar80._28_4_ = fVar82;
      local_5ae0 = pfVar1[uVar44 + 2];
      local_5fc0 = auVar57;
      fStack_5dbc = local_5dc0;
      fStack_5db8 = local_5dc0;
      fStack_5db4 = local_5dc0;
      fStack_5db0 = local_5dc0;
      fStack_5dac = local_5dc0;
      fStack_5da8 = local_5dc0;
      fStack_5da4 = local_5dc0;
      fStack_5adc = local_5ae0;
      fStack_5ad8 = local_5ae0;
      fStack_5ad4 = local_5ae0;
      fStack_5ad0 = local_5ae0;
      fStack_5acc = local_5ae0;
      fStack_5ac8 = local_5ae0;
      fStack_5ac4 = local_5ae0;
      fStack_5abc = local_5ac0;
      fStack_5ab8 = local_5ac0;
      fStack_5ab4 = local_5ac0;
      fStack_5ab0 = local_5ac0;
      fStack_5aac = local_5ac0;
      fStack_5aa8 = local_5ac0;
      fStack_5aa4 = local_5ac0;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar75 >> 0x7f,0) != '\0') ||
            (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar75 >> 0xbf,0) != '\0') ||
          (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar75[0x1f] < '\0') {
        local_5c20 = ZEXT1632(auVar14);
        auVar68 = vandps_avx(auVar68,auVar57);
        auVar20._4_4_ = auVar9._4_4_ * fVar88;
        auVar20._0_4_ = auVar9._0_4_ * fVar88;
        auVar20._8_4_ = auVar9._8_4_ * fVar88;
        auVar20._12_4_ = auVar9._12_4_ * fVar88;
        auVar20._16_4_ = fVar88 * 0.0;
        auVar20._20_4_ = fVar88 * 0.0;
        auVar20._24_4_ = fVar88 * 0.0;
        auVar20._28_4_ = 0;
        auVar90 = ZEXT436(0);
        auVar4 = vfmadd213ps_fma(local_5e60,ZEXT1632(auVar11),auVar20);
        auVar4 = vfmadd213ps_fma(local_5f00._0_32_,ZEXT1632(auVar10),ZEXT1632(auVar4));
        auVar74._0_4_ = (float)(uVar104 ^ auVar4._0_4_);
        auVar74._4_4_ = (float)(uVar107 ^ auVar4._4_4_);
        auVar74._8_4_ = (float)(uVar108 ^ auVar4._8_4_);
        auVar74._12_4_ = (float)(uVar109 ^ auVar4._12_4_);
        auVar74._16_4_ = fVar110;
        auVar74._20_4_ = fVar111;
        auVar74._24_4_ = fVar113;
        auVar74._28_4_ = uVar49;
        auVar75 = vcmpps_avx(auVar74,_DAT_01f7b000,5);
        auVar105 = auVar68 & auVar75;
        local_5ed0 = uVar47;
        local_5e00 = auVar59;
        local_5c00 = auVar65;
        local_5be0 = auVar76;
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          auVar105 = vandps_avx(ZEXT1632(auVar56),local_5bc0);
          auVar90 = ZEXT436(auVar105._28_4_);
          auVar68 = vandps_avx(auVar75,auVar68);
          auVar75 = vsubps_avx(auVar105,auVar59);
          auVar75 = vcmpps_avx(auVar75,auVar74,5);
          auVar5 = auVar68 & auVar75;
          if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar5 >> 0x7f,0) != '\0') ||
                (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar5 >> 0xbf,0) != '\0') ||
              (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar5[0x1f] < '\0') {
            local_5f00._0_8_ = lVar43;
            auVar68 = vandps_avx(auVar75,auVar68);
            auVar21._4_4_ = auVar84._4_4_ * auVar14._4_4_;
            auVar21._0_4_ = auVar84._0_4_ * auVar14._0_4_;
            auVar21._8_4_ = auVar84._8_4_ * auVar14._8_4_;
            auVar21._12_4_ = auVar84._12_4_ * auVar14._12_4_;
            auVar21._16_4_ = auVar84._16_4_ * 0.0;
            auVar21._20_4_ = auVar84._20_4_ * 0.0;
            auVar21._24_4_ = auVar84._24_4_ * 0.0;
            auVar21._28_4_ = 0x80000000;
            auVar4 = vfmadd132ps_fma(auVar83,auVar21,auVar65);
            auVar4 = vfmadd132ps_fma(auVar77,ZEXT1632(auVar4),auVar76);
            auVar92._0_4_ = (float)(uVar104 ^ auVar4._0_4_);
            auVar92._4_4_ = (float)(uVar107 ^ auVar4._4_4_);
            auVar92._8_4_ = (float)(uVar108 ^ auVar4._8_4_);
            auVar92._12_4_ = (float)(uVar109 ^ auVar4._12_4_);
            auVar92._16_4_ = fVar110;
            auVar92._20_4_ = fVar111;
            auVar92._24_4_ = fVar113;
            auVar92._28_4_ = uVar49;
            auVar97._0_4_ = auVar105._0_4_ * *(float *)(ray + 0x60);
            auVar97._4_4_ = auVar105._4_4_ * *(float *)(ray + 100);
            auVar97._8_4_ = auVar105._8_4_ * *(float *)(ray + 0x68);
            auVar97._12_4_ = auVar105._12_4_ * *(float *)(ray + 0x6c);
            auVar97._16_4_ = auVar105._16_4_ * *(float *)(ray + 0x70);
            auVar97._20_4_ = auVar105._20_4_ * *(float *)(ray + 0x74);
            auVar97._24_4_ = auVar105._24_4_ * *(float *)(ray + 0x78);
            auVar97._28_4_ = 0;
            auVar22._4_4_ = auVar105._4_4_ * *(float *)(ray + 0x104);
            auVar22._0_4_ = auVar105._0_4_ * *(float *)(ray + 0x100);
            auVar22._8_4_ = auVar105._8_4_ * *(float *)(ray + 0x108);
            auVar22._12_4_ = auVar105._12_4_ * *(float *)(ray + 0x10c);
            auVar22._16_4_ = auVar105._16_4_ * *(float *)(ray + 0x110);
            auVar22._20_4_ = auVar105._20_4_ * *(float *)(ray + 0x114);
            auVar22._24_4_ = auVar105._24_4_ * *(float *)(ray + 0x118);
            auVar22._28_4_ = 0x80000000;
            auVar75 = vcmpps_avx(auVar97,auVar92,1);
            auVar76 = vcmpps_avx(auVar92,auVar22,2);
            auVar75 = vandps_avx(auVar76,auVar75);
            auVar76 = auVar68 & auVar75;
            local_5e60 = auVar80;
            auVar70 = auVar71;
            if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0x7f,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0xbf,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar76[0x1f] < '\0') {
              auVar68 = vandps_avx(auVar68,auVar75);
              auVar75 = vcmpps_avx(ZEXT1632(auVar56),_DAT_01f7b000,4);
              auVar76 = auVar68 & auVar75;
              if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar76 >> 0x7f,0) != '\0') ||
                    (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0xbf,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar76[0x1f] < '\0') {
                auVar68 = vandps_avx(auVar75,auVar68);
                local_5f30 = (context->scene->geometries).items[uVar47].ptr;
                uVar104 = local_5f30->mask;
                auVar99._4_4_ = uVar104;
                auVar99._0_4_ = uVar104;
                auVar99._8_4_ = uVar104;
                auVar99._12_4_ = uVar104;
                auVar99._16_4_ = uVar104;
                auVar99._20_4_ = uVar104;
                auVar99._24_4_ = uVar104;
                auVar99._28_4_ = uVar104;
                auVar75 = vpand_avx2(auVar99,*(undefined1 (*) [32])(ray + 0x120));
                auVar76 = vpcmpeqd_avx2(auVar75,_DAT_01f7b000);
                auVar75 = auVar68 & ~auVar76;
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar75 >> 0x7f,0) != '\0') ||
                      (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0xbf,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar75[0x1f] < '\0') {
                  local_5f20 = vandnps_avx(auVar76,auVar68);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (auVar90 = ZEXT436(auVar105._28_4_),
                     local_5f30->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar68 = vrcpps_avx(auVar105);
                    auVar100._8_4_ = 0x3f800000;
                    auVar100._0_8_ = 0x3f8000003f800000;
                    auVar100._12_4_ = 0x3f800000;
                    auVar100._16_4_ = 0x3f800000;
                    auVar100._20_4_ = 0x3f800000;
                    auVar100._24_4_ = 0x3f800000;
                    auVar100._28_4_ = 0x3f800000;
                    auVar56 = vfnmadd213ps_fma(auVar105,auVar68,auVar100);
                    auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar68,auVar68);
                    fVar82 = auVar56._0_4_;
                    fVar87 = auVar56._4_4_;
                    local_5ce0._4_4_ = fVar87 * auVar92._4_4_;
                    local_5ce0._0_4_ = fVar82 * auVar92._0_4_;
                    fVar88 = auVar56._8_4_;
                    fStack_5cd8 = fVar88 * auVar92._8_4_;
                    fVar89 = auVar56._12_4_;
                    fStack_5cd4 = fVar89 * auVar92._12_4_;
                    fStack_5cd0 = fVar110 * 0.0;
                    fStack_5ccc = fVar111 * 0.0;
                    fStack_5cc8 = fVar113 * 0.0;
                    uStack_5cc4 = uVar49;
                    auVar25._4_4_ = fVar87 * auVar59._4_4_;
                    auVar25._0_4_ = fVar82 * auVar59._0_4_;
                    auVar25._8_4_ = fVar88 * auVar59._8_4_;
                    auVar25._12_4_ = fVar89 * auVar59._12_4_;
                    auVar25._16_4_ = fVar110 * 0.0;
                    auVar25._20_4_ = fVar111 * 0.0;
                    auVar25._24_4_ = fVar113 * 0.0;
                    auVar25._28_4_ = local_5f20._28_4_;
                    auVar68 = vminps_avx(auVar25,auVar100);
                    auVar26._4_4_ = fVar87 * auVar74._4_4_;
                    auVar26._0_4_ = fVar82 * auVar74._0_4_;
                    auVar26._8_4_ = fVar88 * auVar74._8_4_;
                    auVar26._12_4_ = fVar89 * auVar74._12_4_;
                    auVar26._16_4_ = fVar110 * 0.0;
                    auVar26._20_4_ = fVar111 * 0.0;
                    auVar26._24_4_ = fVar113 * 0.0;
                    auVar26._28_4_ = uVar49;
                    auVar57 = vminps_avx(auVar26,auVar100);
                    auVar75 = vsubps_avx(auVar100,auVar68);
                    auVar76 = vsubps_avx(auVar100,auVar57);
                    auVar32._8_8_ = uStack_5b18;
                    auVar32._0_8_ = local_5b20;
                    auVar32._16_8_ = uStack_5b10;
                    auVar32._24_8_ = uStack_5b08;
                    _local_5ca0 = vblendvps_avx(auVar68,auVar75,auVar32);
                    local_5cc0 = vblendvps_avx(auVar57,auVar76,auVar32);
                    local_5d40.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar12);
                    local_5d40.field_0.y.field_0 = (vfloat_impl<8>)ZEXT1632(auVar13);
                    local_5d40.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar14);
                    local_5f90.valid = local_5ba0;
                    local_5f90.geometryUserPtr = &local_5da0;
                    local_5f90.context = local_5d80;
                    local_5f90.ray = local_5d60;
                    auVar90 = (undefined1  [36])0x0;
                    in_ZMM15 = ZEXT1664(auVar10);
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                    ::
                    _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                *)&local_5f90,
                               (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                *)&local_5d40.field_0);
                    pRVar2 = context->user;
                    local_5c80._4_4_ = (undefined4)local_5ed0;
                    local_5c80._0_4_ = (undefined4)local_5ed0;
                    local_5c80._8_4_ = (undefined4)local_5ed0;
                    local_5c80._12_4_ = (undefined4)local_5ed0;
                    local_5c80._16_4_ = (undefined4)local_5ed0;
                    local_5c80._20_4_ = (undefined4)local_5ed0;
                    local_5c80._24_4_ = (undefined4)local_5ed0;
                    local_5c80._28_4_ = (undefined4)local_5ed0;
                    local_5d40.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b80;
                    auVar72 = ZEXT436((uint)local_5d80[3].instPrimID[0]);
                    local_5ca0._4_4_ = iVar41;
                    local_5ca0._0_4_ = iVar41;
                    fStack_5c98 = (float)iVar41;
                    fStack_5c94 = (float)iVar41;
                    fStack_5c90 = (float)iVar41;
                    fStack_5c8c = (float)iVar41;
                    fStack_5c88 = (float)iVar41;
                    fStack_5c84 = (float)iVar41;
                    auVar68 = vpcmpeqd_avx2(local_5c80,local_5c80);
                    local_5ec8[1] = auVar68;
                    *local_5ec8 = auVar68;
                    local_5c60 = pRVar2->instID[0];
                    local_5c40 = pRVar2->instPrimID[0];
                    local_5e00 = *(undefined1 (*) [32])(ray + 0x100);
                    auVar68 = vblendvps_avx(local_5e00,(undefined1  [32])local_5da0,local_5f20);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar68;
                    local_5ea0 = local_5f20;
                    local_5f90.valid = (int *)local_5ea0;
                    local_5f90.geometryUserPtr = local_5f30->userPtr;
                    local_5f90.context = context->user;
                    local_5f90.hit = (RTCHitN *)&local_5d40;
                    local_5f90.N = 8;
                    local_5f90.ray = (RTCRayN *)ray;
                    uStack_5c5c = local_5c60;
                    uStack_5c58 = local_5c60;
                    uStack_5c54 = local_5c60;
                    uStack_5c50 = local_5c60;
                    uStack_5c4c = local_5c60;
                    uStack_5c48 = local_5c60;
                    uStack_5c44 = local_5c60;
                    uStack_5c3c = local_5c40;
                    uStack_5c38 = local_5c40;
                    uStack_5c34 = local_5c40;
                    uStack_5c30 = local_5c40;
                    uStack_5c2c = local_5c40;
                    uStack_5c28 = local_5c40;
                    uStack_5c24 = local_5c40;
                    if (local_5f30->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar72 = (undefined1  [36])0x0;
                      auVar90 = (undefined1  [36])0x0;
                      in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                      (*local_5f30->occlusionFilterN)(&local_5f90);
                    }
                    auVar57 = vpcmpeqd_avx2(local_5ea0,_DAT_01f7b000);
                    auVar68 = _DAT_01f7b020 & ~auVar57;
                    if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar68 >> 0x7f,0) == '\0') &&
                          (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar68 >> 0xbf,0) == '\0') &&
                        (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar68[0x1f]) {
                      local_5f20._0_8_ = auVar57._0_8_ ^ 0xffffffffffffffff;
                      local_5f20._8_4_ = auVar57._8_4_ ^ 0xffffffff;
                      local_5f20._12_4_ = auVar57._12_4_ ^ 0xffffffff;
                      local_5f20._16_4_ = auVar57._16_4_ ^ 0xffffffff;
                      local_5f20._20_4_ = auVar57._20_4_ ^ 0xffffffff;
                      local_5f20._24_4_ = auVar57._24_4_ ^ 0xffffffff;
                      local_5f20._28_4_ = auVar57._28_4_ ^ 0xffffffff;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_5f30->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar72 = (undefined1  [36])0x0;
                        auVar90 = (undefined1  [36])0x0;
                        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                        local_5f20 = local_5ea0;
                        (*p_Var3)(&local_5f90);
                      }
                      auVar68 = vpcmpeqd_avx2(local_5ea0,_DAT_01f7b000);
                      local_5f20 = auVar68 ^ _DAT_01f7b020;
                      auVar60._8_4_ = 0xff800000;
                      auVar60._0_8_ = 0xff800000ff800000;
                      auVar60._12_4_ = 0xff800000;
                      auVar60._16_4_ = 0xff800000;
                      auVar60._20_4_ = 0xff800000;
                      auVar60._24_4_ = 0xff800000;
                      auVar60._28_4_ = 0xff800000;
                      auVar68 = vblendvps_avx(auVar60,*(undefined1 (*) [32])(local_5f90.ray + 0x100)
                                              ,auVar68);
                      *(undefined1 (*) [32])(local_5f90.ray + 0x100) = auVar68;
                    }
                    auVar68 = vblendvps_avx(local_5e00,*(undefined1 (*) [32])local_5f28,local_5f20);
                    *(undefined1 (*) [32])local_5f28 = auVar68;
                  }
                  auVar57 = vandnps_avx(local_5f20,local_5fc0);
                  lVar43 = local_5f00._0_8_;
                  auVar80 = local_5e60;
                  auVar70 = auVar72;
                }
              }
            }
          }
        }
      }
      if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar57 >> 0x7f,0) == '\0') &&
            (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar57 >> 0xbf,0) == '\0') &&
          (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar57[0x1f])
      {
        auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        break;
      }
      auVar34._4_4_ = fStack_5abc;
      auVar34._0_4_ = local_5ac0;
      auVar34._8_4_ = fStack_5ab8;
      auVar34._12_4_ = fStack_5ab4;
      auVar34._16_4_ = fStack_5ab0;
      auVar34._20_4_ = fStack_5aac;
      auVar34._24_4_ = fStack_5aa8;
      auVar34._28_4_ = fStack_5aa4;
      auVar30._4_4_ = fStack_5dbc;
      auVar30._0_4_ = local_5dc0;
      auVar30._8_4_ = fStack_5db8;
      auVar30._12_4_ = fStack_5db4;
      auVar30._16_4_ = fStack_5db0;
      auVar30._20_4_ = fStack_5dac;
      auVar30._24_4_ = fStack_5da8;
      auVar30._28_4_ = fStack_5da4;
      auVar77 = vsubps_avx(auVar34,auVar30);
      auVar36._4_4_ = fStack_5a5c;
      auVar36._0_4_ = local_5a60;
      auVar36._8_4_ = fStack_5a58;
      auVar36._12_4_ = fStack_5a54;
      auVar36._16_4_ = fStack_5a50;
      auVar36._20_4_ = fStack_5a4c;
      auVar36._24_4_ = fStack_5a48;
      auVar36._28_4_ = fStack_5a44;
      auVar83 = vsubps_avx(auVar80,auVar36);
      auVar33._4_4_ = fStack_5adc;
      auVar33._0_4_ = local_5ae0;
      auVar33._8_4_ = fStack_5ad8;
      auVar33._12_4_ = fStack_5ad4;
      auVar33._16_4_ = fStack_5ad0;
      auVar33._20_4_ = fStack_5acc;
      auVar33._24_4_ = fStack_5ac8;
      auVar33._28_4_ = fStack_5ac4;
      auVar35._4_4_ = fStack_5a7c;
      auVar35._0_4_ = local_5a80;
      auVar35._8_4_ = fStack_5a78;
      auVar35._12_4_ = fStack_5a74;
      auVar35._16_4_ = fStack_5a70;
      auVar35._20_4_ = fStack_5a6c;
      auVar35._24_4_ = fStack_5a68;
      auVar35._28_4_ = fStack_5a64;
      auVar84 = vsubps_avx(auVar33,auVar35);
      auVar65 = vsubps_avx(_local_5f60,auVar34);
      auVar105 = vsubps_avx(_local_5ec0,auVar80);
      auVar5 = vsubps_avx(_local_5e40,auVar33);
      auVar103._0_4_ = auVar83._0_4_ * auVar5._0_4_;
      auVar103._4_4_ = auVar83._4_4_ * auVar5._4_4_;
      auVar103._8_4_ = auVar83._8_4_ * auVar5._8_4_;
      auVar103._12_4_ = auVar83._12_4_ * auVar5._12_4_;
      auVar103._16_4_ = auVar83._16_4_ * auVar5._16_4_;
      auVar103._20_4_ = auVar83._20_4_ * auVar5._20_4_;
      auVar103._24_4_ = auVar83._24_4_ * auVar5._24_4_;
      auVar103._28_36_ = auVar70;
      auVar4 = vfmsub231ps_fma(auVar103._0_32_,auVar105,auVar84);
      auVar86._0_4_ = auVar84._0_4_ * auVar65._0_4_;
      auVar86._4_4_ = auVar84._4_4_ * auVar65._4_4_;
      auVar86._8_4_ = auVar84._8_4_ * auVar65._8_4_;
      auVar86._12_4_ = auVar84._12_4_ * auVar65._12_4_;
      auVar86._16_4_ = auVar84._16_4_ * auVar65._16_4_;
      auVar86._20_4_ = auVar84._20_4_ * auVar65._20_4_;
      auVar86._24_4_ = auVar84._24_4_ * auVar65._24_4_;
      auVar86._28_36_ = auVar90;
      auVar12 = vfmsub231ps_fma(auVar86._0_32_,auVar5,auVar77);
      auVar15._4_4_ = auVar105._4_4_ * auVar77._4_4_;
      auVar15._0_4_ = auVar105._0_4_ * auVar77._0_4_;
      auVar15._8_4_ = auVar105._8_4_ * auVar77._8_4_;
      auVar15._12_4_ = auVar105._12_4_ * auVar77._12_4_;
      auVar15._16_4_ = auVar105._16_4_ * auVar77._16_4_;
      auVar15._20_4_ = auVar105._20_4_ * auVar77._20_4_;
      auVar15._24_4_ = auVar105._24_4_ * auVar77._24_4_;
      auVar15._28_4_ = auVar77._28_4_;
      auVar6 = vsubps_avx(auVar34,*(undefined1 (*) [32])ray);
      auVar7 = vsubps_avx(auVar80,*(undefined1 (*) [32])(ray + 0x20));
      auVar8 = vsubps_avx(auVar33,*(undefined1 (*) [32])(ray + 0x40));
      auVar13 = vfmsub231ps_fma(auVar15,auVar65,auVar83);
      auVar68 = *(undefined1 (*) [32])(ray + 0x80);
      auVar75 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar29._4_4_ = auVar68._4_4_ * auVar7._4_4_;
      auVar29._0_4_ = auVar68._0_4_ * auVar7._0_4_;
      auVar29._8_4_ = auVar68._8_4_ * auVar7._8_4_;
      auVar29._12_4_ = auVar68._12_4_ * auVar7._12_4_;
      auVar29._16_4_ = auVar68._16_4_ * auVar7._16_4_;
      auVar29._20_4_ = auVar68._20_4_ * auVar7._20_4_;
      auVar29._24_4_ = auVar68._24_4_ * auVar7._24_4_;
      auVar29._28_4_ = auVar57._28_4_;
      auVar14 = vfmsub231ps_fma(auVar29,auVar6,auVar75);
      auVar76 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar80 = ZEXT1632(auVar13);
      auVar16._4_4_ = auVar76._4_4_ * auVar13._4_4_;
      auVar16._0_4_ = auVar76._0_4_ * auVar13._0_4_;
      auVar16._8_4_ = auVar76._8_4_ * auVar13._8_4_;
      auVar16._12_4_ = auVar76._12_4_ * auVar13._12_4_;
      auVar16._16_4_ = auVar76._16_4_ * 0.0;
      auVar16._20_4_ = auVar76._20_4_ * 0.0;
      auVar16._24_4_ = auVar76._24_4_ * 0.0;
      auVar16._28_4_ = fStack_5ac4;
      auVar56 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar12),auVar75);
      auVar17._4_4_ = auVar75._4_4_ * auVar8._4_4_;
      auVar17._0_4_ = auVar75._0_4_ * auVar8._0_4_;
      auVar17._8_4_ = auVar75._8_4_ * auVar8._8_4_;
      auVar17._12_4_ = auVar75._12_4_ * auVar8._12_4_;
      auVar17._16_4_ = auVar75._16_4_ * auVar8._16_4_;
      auVar17._20_4_ = auVar75._20_4_ * auVar8._20_4_;
      auVar17._24_4_ = auVar75._24_4_ * auVar8._24_4_;
      auVar17._28_4_ = auVar75._28_4_;
      auVar9 = vfmsub231ps_fma(auVar17,auVar7,auVar76);
      auVar18._4_4_ = auVar76._4_4_ * auVar6._4_4_;
      auVar18._0_4_ = auVar76._0_4_ * auVar6._0_4_;
      auVar18._8_4_ = auVar76._8_4_ * auVar6._8_4_;
      auVar18._12_4_ = auVar76._12_4_ * auVar6._12_4_;
      auVar18._16_4_ = auVar76._16_4_ * auVar6._16_4_;
      auVar18._20_4_ = auVar76._20_4_ * auVar6._20_4_;
      auVar18._24_4_ = auVar76._24_4_ * auVar6._24_4_;
      auVar18._28_4_ = auVar76._28_4_;
      auVar10 = vfmsub231ps_fma(auVar18,auVar8,auVar68);
      in_ZMM15 = ZEXT1664(auVar10);
      local_5d40.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar4);
      auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),(undefined1  [32])local_5d40.field_0.x.field_0,
                                auVar68);
      auVar19._4_4_ = auVar5._4_4_ * auVar14._4_4_;
      auVar19._0_4_ = auVar5._0_4_ * auVar14._0_4_;
      auVar19._8_4_ = auVar5._8_4_ * auVar14._8_4_;
      auVar19._12_4_ = auVar5._12_4_ * auVar14._12_4_;
      auVar19._16_4_ = auVar5._16_4_ * 0.0;
      auVar19._20_4_ = auVar5._20_4_ * 0.0;
      auVar19._24_4_ = auVar5._24_4_ * 0.0;
      auVar19._28_4_ = auVar68._28_4_;
      auVar4 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar10),auVar105);
      auVar68 = vandps_avx(ZEXT1632(auVar56),local_5aa0);
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar9),auVar65);
      uVar104 = auVar68._0_4_;
      auVar73._0_4_ = (float)(uVar104 ^ auVar4._0_4_);
      uVar107 = auVar68._4_4_;
      auVar73._4_4_ = (float)(uVar107 ^ auVar4._4_4_);
      uVar108 = auVar68._8_4_;
      auVar73._8_4_ = (float)(uVar108 ^ auVar4._8_4_);
      uVar109 = auVar68._12_4_;
      auVar73._12_4_ = (float)(uVar109 ^ auVar4._12_4_);
      fVar82 = auVar68._16_4_;
      auVar73._16_4_ = fVar82;
      fVar110 = auVar68._20_4_;
      auVar73._20_4_ = fVar110;
      fVar111 = auVar68._24_4_;
      auVar73._24_4_ = fVar111;
      uVar49 = auVar68._28_4_;
      auVar73._28_4_ = uVar49;
      auVar68 = vcmpps_avx(auVar73,_DAT_01f7b000,5);
      auVar75 = auVar57 & auVar68;
      _local_5ec0 = auVar83;
      local_5fc0 = auVar57;
      if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar75 >> 0x7f,0) == '\0') &&
            (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar75 >> 0xbf,0) == '\0') &&
          (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar75[0x1f])
      {
LAB_016a4bda:
        auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        auVar68 = vandps_avx(auVar68,auVar57);
        auVar53._0_4_ = auVar84._0_4_ * auVar14._0_4_;
        auVar53._4_4_ = auVar84._4_4_ * auVar14._4_4_;
        auVar53._8_4_ = auVar84._8_4_ * auVar14._8_4_;
        auVar53._12_4_ = auVar84._12_4_ * auVar14._12_4_;
        auVar53._16_4_ = auVar84._16_4_ * 0.0;
        auVar53._20_4_ = auVar84._20_4_ * 0.0;
        auVar53._24_4_ = auVar84._24_4_ * 0.0;
        auVar53._28_4_ = 0;
        auVar4 = vfmadd213ps_fma(auVar83,ZEXT1632(auVar10),auVar53);
        auVar4 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar9),ZEXT1632(auVar4));
        auVar81._0_4_ = (float)(uVar104 ^ auVar4._0_4_);
        auVar81._4_4_ = (float)(uVar107 ^ auVar4._4_4_);
        auVar81._8_4_ = (float)(uVar108 ^ auVar4._8_4_);
        auVar81._12_4_ = (float)(uVar109 ^ auVar4._12_4_);
        auVar81._16_4_ = fVar82;
        auVar81._20_4_ = fVar110;
        auVar81._24_4_ = fVar111;
        auVar81._28_4_ = uVar49;
        auVar75 = vcmpps_avx(auVar81,_DAT_01f7b000,5);
        auVar76 = auVar68 & auVar75;
        _local_5e40 = auVar80;
        if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar76 >> 0x7f,0) == '\0') &&
              (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar76 >> 0xbf,0) == '\0') &&
            (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar76[0x1f]) goto LAB_016a4bda;
        auVar76 = vandps_avx(ZEXT1632(auVar56),local_5bc0);
        auVar68 = vandps_avx(auVar75,auVar68);
        auVar77 = vsubps_avx(auVar76,auVar73);
        auVar75 = vcmpps_avx(auVar77,auVar81,5);
        auVar84 = auVar68 & auVar75;
        if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar84 >> 0x7f,0) == '\0') &&
              (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar84 >> 0xbf,0) == '\0') &&
            (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar84[0x1f]) goto LAB_016a4bda;
        local_5f00._0_8_ = lVar43;
        auVar68 = vandps_avx(auVar75,auVar68);
        auVar23._4_4_ = auVar8._4_4_ * auVar13._4_4_;
        auVar23._0_4_ = auVar8._0_4_ * auVar13._0_4_;
        auVar23._8_4_ = auVar8._8_4_ * auVar13._8_4_;
        auVar23._12_4_ = auVar8._12_4_ * auVar13._12_4_;
        auVar23._16_4_ = auVar8._16_4_ * 0.0;
        auVar23._20_4_ = auVar8._20_4_ * 0.0;
        auVar23._24_4_ = auVar8._24_4_ * 0.0;
        auVar23._28_4_ = auVar77._28_4_;
        auVar4 = vfmadd213ps_fma(auVar7,ZEXT1632(auVar12),auVar23);
        auVar4 = vfmadd213ps_fma(auVar6,(undefined1  [32])local_5d40.field_0.x.field_0,
                                 ZEXT1632(auVar4));
        auVar66._0_4_ = (float)(uVar104 ^ auVar4._0_4_);
        auVar66._4_4_ = (float)(uVar107 ^ auVar4._4_4_);
        auVar66._8_4_ = (float)(uVar108 ^ auVar4._8_4_);
        auVar66._12_4_ = (float)(uVar109 ^ auVar4._12_4_);
        auVar66._16_4_ = fVar82;
        auVar66._20_4_ = fVar110;
        auVar66._24_4_ = fVar111;
        auVar66._28_4_ = uVar49;
        auVar24._4_4_ = auVar76._4_4_ * *(float *)(ray + 100);
        auVar24._0_4_ = auVar76._0_4_ * *(float *)(ray + 0x60);
        auVar24._8_4_ = auVar76._8_4_ * *(float *)(ray + 0x68);
        auVar24._12_4_ = auVar76._12_4_ * *(float *)(ray + 0x6c);
        auVar24._16_4_ = auVar76._16_4_ * *(float *)(ray + 0x70);
        auVar24._20_4_ = auVar76._20_4_ * *(float *)(ray + 0x74);
        auVar24._24_4_ = auVar76._24_4_ * *(float *)(ray + 0x78);
        auVar24._28_4_ = auVar77._28_4_;
        auVar93._0_4_ = auVar76._0_4_ * *(float *)(ray + 0x100);
        auVar93._4_4_ = auVar76._4_4_ * *(float *)(ray + 0x104);
        auVar93._8_4_ = auVar76._8_4_ * *(float *)(ray + 0x108);
        auVar93._12_4_ = auVar76._12_4_ * *(float *)(ray + 0x10c);
        auVar93._16_4_ = auVar76._16_4_ * *(float *)(ray + 0x110);
        auVar93._20_4_ = auVar76._20_4_ * *(float *)(ray + 0x114);
        auVar93._24_4_ = auVar76._24_4_ * *(float *)(ray + 0x118);
        auVar93._28_4_ = 0;
        auVar75 = vcmpps_avx(auVar24,auVar66,1);
        auVar77 = vcmpps_avx(auVar66,auVar93,2);
        auVar75 = vandps_avx(auVar77,auVar75);
        auVar77 = auVar68 & auVar75;
        if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar77 >> 0x7f,0) == '\0') &&
              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar77 >> 0xbf,0) == '\0') &&
            (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar77[0x1f]) goto LAB_016a4bda;
        auVar68 = vandps_avx(auVar68,auVar75);
        auVar75 = vcmpps_avx(ZEXT1632(auVar56),_DAT_01f7b000,4);
        auVar77 = auVar68 & auVar75;
        if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar77 >> 0x7f,0) == '\0') &&
              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar77 >> 0xbf,0) == '\0') &&
            (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar77[0x1f]) goto LAB_016a4bda;
        auVar68 = vandps_avx(auVar75,auVar68);
        uVar107 = *(uint *)(lVar50 + lVar51);
        unaff_R12 = (ulong)uVar107;
        local_5ec0 = (undefined1  [8])(context->scene->geometries).items[unaff_R12].ptr;
        _auStack_5eb8 = auVar83._8_24_;
        uVar104 = ((Geometry *)local_5ec0)->mask;
        auVar54._4_4_ = uVar104;
        auVar54._0_4_ = uVar104;
        auVar54._8_4_ = uVar104;
        auVar54._12_4_ = uVar104;
        auVar54._16_4_ = uVar104;
        auVar54._20_4_ = uVar104;
        auVar54._24_4_ = uVar104;
        auVar54._28_4_ = uVar104;
        auVar75 = vpand_avx2(auVar54,*(undefined1 (*) [32])(ray + 0x120));
        auVar77 = vpcmpeqd_avx2(auVar75,_DAT_01f7b000);
        auVar75 = auVar68 & ~auVar77;
        if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar75 >> 0x7f,0) == '\0') &&
              (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar75 >> 0xbf,0) == '\0') &&
            (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar75[0x1f]) goto LAB_016a4bda;
        local_5dc0 = *(float *)(lVar50 + 0x10 + lVar51);
        _local_5f60 = vandnps_avx(auVar77,auVar68);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (((Geometry *)local_5ec0)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar75 = vrcpps_avx(auVar76);
          auVar94._8_4_ = 0x3f800000;
          auVar94._0_8_ = 0x3f8000003f800000;
          auVar94._12_4_ = 0x3f800000;
          auVar94._16_4_ = 0x3f800000;
          auVar94._20_4_ = 0x3f800000;
          auVar94._24_4_ = 0x3f800000;
          auVar94._28_4_ = 0x3f800000;
          auVar56 = vfnmadd213ps_fma(auVar76,auVar75,auVar94);
          auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar75,auVar75);
          fVar113 = auVar56._0_4_;
          fVar87 = auVar56._4_4_;
          fVar88 = auVar56._8_4_;
          fVar89 = auVar56._12_4_;
          auVar27._4_4_ = fVar87 * auVar73._4_4_;
          auVar27._0_4_ = fVar113 * auVar73._0_4_;
          auVar27._8_4_ = fVar88 * auVar73._8_4_;
          auVar27._12_4_ = fVar89 * auVar73._12_4_;
          auVar27._16_4_ = fVar82 * 0.0;
          auVar27._20_4_ = fVar110 * 0.0;
          auVar27._24_4_ = fVar111 * 0.0;
          auVar27._28_4_ = uVar49;
          auVar68 = vminps_avx(auVar27,auVar94);
          auVar28._4_4_ = fVar87 * auVar81._4_4_;
          auVar28._0_4_ = fVar113 * auVar81._0_4_;
          auVar28._8_4_ = fVar88 * auVar81._8_4_;
          auVar28._12_4_ = fVar89 * auVar81._12_4_;
          auVar28._16_4_ = fVar82 * 0.0;
          auVar28._20_4_ = fVar110 * 0.0;
          auVar28._24_4_ = fVar111 * 0.0;
          auVar28._28_4_ = uVar49;
          auVar57 = vminps_avx(auVar28,auVar94);
          auVar76 = vsubps_avx(auVar94,auVar68);
          auVar77 = vsubps_avx(auVar94,auVar57);
          auVar31._8_8_ = uStack_5b38;
          auVar31._0_8_ = local_5b40;
          auVar31._16_8_ = uStack_5b30;
          auVar31._24_8_ = uStack_5b28;
          _local_5ca0 = vblendvps_avx(auVar68,auVar76,auVar31);
          local_5cc0 = vblendvps_avx(auVar57,auVar77,auVar31);
          local_5d40.field_0.y.field_0 = (vfloat_impl<8>)ZEXT1632(auVar12);
          local_5d40.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar13);
          local_5ce0._4_4_ = fVar87 * auVar66._4_4_;
          local_5ce0._0_4_ = fVar113 * auVar66._0_4_;
          fStack_5cd8 = fVar88 * auVar66._8_4_;
          fStack_5cd4 = fVar89 * auVar66._12_4_;
          fStack_5cd0 = fVar82 * 0.0;
          fStack_5ccc = fVar110 * 0.0;
          fStack_5cc8 = fVar111 * 0.0;
          uStack_5cc4 = auVar75._28_4_;
          local_5f90.valid = local_5ba0;
          local_5f90.geometryUserPtr = &local_5da0;
          local_5f90.context = local_5d80;
          local_5f90.ray = local_5d60;
          in_ZMM15 = ZEXT1664(auVar10);
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5f90,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5d40.field_0);
          pRVar2 = context->user;
          local_5c80._4_4_ = uVar107;
          local_5c80._0_4_ = uVar107;
          local_5c80._8_4_ = uVar107;
          local_5c80._12_4_ = uVar107;
          local_5c80._16_4_ = uVar107;
          local_5c80._20_4_ = uVar107;
          local_5c80._24_4_ = uVar107;
          local_5c80._28_4_ = uVar107;
          local_5d40.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b80;
          local_5ca0._4_4_ = local_5dc0;
          local_5ca0._0_4_ = local_5dc0;
          fStack_5c98 = local_5dc0;
          fStack_5c94 = local_5dc0;
          fStack_5c90 = local_5dc0;
          fStack_5c8c = local_5dc0;
          fStack_5c88 = local_5dc0;
          fStack_5c84 = local_5dc0;
          auVar68 = vpcmpeqd_avx2(local_5c80,local_5c80);
          local_5ec8[1] = auVar68;
          *local_5ec8 = auVar68;
          local_5c60 = pRVar2->instID[0];
          local_5c40 = pRVar2->instPrimID[0];
          _local_5e40 = *(undefined1 (*) [32])(ray + 0x100);
          auVar68 = vblendvps_avx(_local_5e40,(undefined1  [32])local_5da0,_local_5f60);
          *(undefined1 (*) [32])(ray + 0x100) = auVar68;
          local_5ea0 = _local_5f60;
          local_5f90.valid = (int *)local_5ea0;
          local_5f90.geometryUserPtr = *(void **)((long)local_5ec0 + 0x18);
          local_5f90.context = context->user;
          local_5f90.hit = (RTCHitN *)&local_5d40;
          local_5f90.N = 8;
          local_5f90.ray = (RTCRayN *)ray;
          uStack_5c5c = local_5c60;
          uStack_5c58 = local_5c60;
          uStack_5c54 = local_5c60;
          uStack_5c50 = local_5c60;
          uStack_5c4c = local_5c60;
          uStack_5c48 = local_5c60;
          uStack_5c44 = local_5c60;
          uStack_5c3c = local_5c40;
          uStack_5c38 = local_5c40;
          uStack_5c34 = local_5c40;
          uStack_5c30 = local_5c40;
          uStack_5c2c = local_5c40;
          uStack_5c28 = local_5c40;
          uStack_5c24 = local_5c40;
          if (*(code **)((long)local_5ec0 + 0x48) != (code *)0x0) {
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            (**(code **)((long)local_5ec0 + 0x48))(&local_5f90);
          }
          auVar57 = vpcmpeqd_avx2(local_5ea0,_DAT_01f7b000);
          auVar68 = _DAT_01f7b020 & ~auVar57;
          if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar68 >> 0x7f,0) == '\0') &&
                (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar68 >> 0xbf,0) == '\0') &&
              (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar68[0x1f]) {
            local_5f60 = (undefined1  [8])(auVar57._0_8_ ^ 0xffffffffffffffff);
            fStack_5f58 = (float)(auVar57._8_4_ ^ 0xffffffff);
            fStack_5f54 = (float)(auVar57._12_4_ ^ 0xffffffff);
            fStack_5f50 = (float)(auVar57._16_4_ ^ 0xffffffff);
            fStack_5f4c = (float)(auVar57._20_4_ ^ 0xffffffff);
            fStack_5f48 = (float)(auVar57._24_4_ ^ 0xffffffff);
            fStack_5f44 = (float)(auVar57._28_4_ ^ 0xffffffff);
          }
          else {
            p_Var3 = context->args->filter;
            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)((long)local_5ec0 + 0x3e) & 0x40) != 0)
                ))) {
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              _local_5f60 = local_5ea0;
              (*p_Var3)(&local_5f90);
            }
            auVar68 = vpcmpeqd_avx2(local_5ea0,_DAT_01f7b000);
            _local_5f60 = auVar68 ^ _DAT_01f7b020;
            auVar61._8_4_ = 0xff800000;
            auVar61._0_8_ = 0xff800000ff800000;
            auVar61._12_4_ = 0xff800000;
            auVar61._16_4_ = 0xff800000;
            auVar61._20_4_ = 0xff800000;
            auVar61._24_4_ = 0xff800000;
            auVar61._28_4_ = 0xff800000;
            auVar68 = vblendvps_avx(auVar61,*(undefined1 (*) [32])(local_5f90.ray + 0x100),auVar68);
            *(undefined1 (*) [32])(local_5f90.ray + 0x100) = auVar68;
          }
          auVar68 = vblendvps_avx(_local_5e40,*(undefined1 (*) [32])local_5f28,_local_5f60);
          *(undefined1 (*) [32])local_5f28 = auVar68;
        }
        auVar57 = vandnps_avx(_local_5f60,local_5fc0);
        auVar68 = local_5fc0 & ~_local_5f60;
        auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        lVar43 = local_5f00._0_8_;
        if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar68 >> 0x7f,0) == '\0') &&
              (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar68 >> 0xbf,0) == '\0') &&
            (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar68[0x1f]) break;
      }
      unaff_R12 = 0;
    }
    auVar69 = ZEXT3264(local_5de0);
    auVar75 = vandps_avx(auVar57,local_5de0);
    lVar42 = local_5e70 + 1;
    lVar50 = lVar50 + 0x60;
    auVar57 = local_5de0 & auVar57;
    auVar68 = local_5de0;
    local_5de0 = auVar75;
  } while ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar57 >> 0x7f,0) != '\0') ||
             (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar57 >> 0xbf,0) != '\0') ||
           (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar57[0x1f] < '\0');
  auVar68 = vpcmpeqd_avx2(auVar68,auVar68);
  auVar55._0_4_ = local_5de0._0_4_ ^ auVar68._0_4_;
  auVar55._4_4_ = local_5de0._4_4_ ^ auVar68._4_4_;
  auVar55._8_4_ = local_5de0._8_4_ ^ auVar68._8_4_;
  auVar55._12_4_ = local_5de0._12_4_ ^ auVar68._12_4_;
  auVar55._16_4_ = local_5de0._16_4_ ^ auVar68._16_4_;
  auVar55._20_4_ = local_5de0._20_4_ ^ auVar68._20_4_;
  auVar55._24_4_ = local_5de0._24_4_ ^ auVar68._24_4_;
  auVar55._28_4_ = local_5de0._28_4_ ^ auVar68._28_4_;
  local_5e20 = vorps_avx(auVar55,local_5e20);
  auVar68 = auVar68 & ~local_5e20;
  if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar68 >> 0x7f,0) == '\0') &&
        (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar68 >> 0xbf,0) == '\0') &&
      (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar68[0x1f])
  goto LAB_016a57b7;
  auVar67._8_4_ = 0xff800000;
  auVar67._0_8_ = 0xff800000ff800000;
  auVar67._12_4_ = 0xff800000;
  auVar67._16_4_ = 0xff800000;
  auVar67._20_4_ = 0xff800000;
  auVar67._24_4_ = 0xff800000;
  auVar67._28_4_ = 0xff800000;
  auVar69 = ZEXT3264(auVar67);
  local_5840 = vblendvps_avx(local_5840,auVar67,local_5e20);
  goto LAB_016a466b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }